

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

void __thiscall om::concurrency::thread_pool::thread_pool(thread_pool *this,uint thread_count_)

{
  thread_pool *local_40;
  code *local_38;
  undefined8 local_30;
  uint local_28;
  uint i;
  uint local_14;
  thread_pool *ptStack_10;
  uint thread_count__local;
  thread_pool *this_local;
  
  local_14 = thread_count_;
  ptStack_10 = this;
  std::atomic<bool>::atomic(&this->_done,false);
  queue<std::function<void_()>_>::queue(&this->_task_queue);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->_threads);
  thread_joiner::thread_joiner(&this->_joiner,&this->_threads);
  for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
    local_38 = _worker_thread;
    local_30 = 0;
    local_40 = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(om::concurrency::thread_pool::*)(),om::concurrency::thread_pool*>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->_threads,(type *)&local_38,
               &local_40);
  }
  return;
}

Assistant:

explicit thread_pool(unsigned thread_count_ = std::thread::hardware_concurrency())
				: _done(false), _joiner(_threads)
			{
				try {
					for (unsigned i = 0; i < thread_count_; i++)
						_threads.emplace_back(&thread_pool::_worker_thread, this);
				} catch(...) {
					_done = true;
					throw;
				}
			}